

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O0

bool __thiscall
iDynTree::ConvexHullProjectionConstraint::buildConvexHull
          (ConvexHullProjectionConstraint *this,Direction *xAxisOfPlaneInWorld,
          Direction *yAxisOfPlaneInWorld,Position *originOfPlaneInWorld,
          vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
          *supportPolygonsExpressedInSupportFrame,
          vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>
          *absoluteFrame_X_supportFrame)

{
  int iVar1;
  Vector2 b;
  Vector2 b_00;
  Vector2 a;
  Vector2 a_00;
  Vector2 o;
  Vector2 o_00;
  Position *pPVar2;
  size_type sVar3;
  size_t sVar4;
  iterator iVar5;
  iterator iVar6;
  reference pvVar7;
  ulong uVar8;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *this_00;
  ConvexHullProjectionConstraint *in_RCX;
  long in_RDI;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *in_R8;
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *in_R9;
  int t;
  int i_2;
  int i_1;
  size_t k;
  anon_struct_1_0_00000001 vector2lexographical;
  Vector2 newProjectedPoint;
  size_t vertex;
  size_t poly;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> projectedPoints
  ;
  size_t i;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
  supportPolygonsExpressedInAbsoluteFrame;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc68;
  Block<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_false>
  *in_stack_fffffffffffffc70;
  value_type *in_stack_fffffffffffffc78;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc80;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc88;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *in_stack_fffffffffffffc90;
  MatrixDynSize *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  undefined1 uVar9;
  reference in_stack_fffffffffffffca8;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
  *in_stack_fffffffffffffcb0;
  double in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  Transform *in_stack_fffffffffffffcd0;
  Polygon *in_stack_fffffffffffffcd8;
  Position *pos3dInAbsoluteFrame;
  ConvexHullProjectionConstraint *this_01;
  int local_1cc;
  int local_194;
  ulong local_190;
  ulong local_158;
  ulong local_150;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> local_148 [2];
  Position *local_118;
  undefined1 local_100 [208];
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *local_30;
  byte local_1;
  
  local_100._200_8_ = in_R9;
  local_30 = in_R8;
  iDynTree::Position::operator=((Position *)(in_RDI + 0xf0),(Position *)in_RCX);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc88);
  toEigen<2u,3u>((MatrixFixSize<2U,_3U> *)in_stack_fffffffffffffc88);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>>::block<1,3>
            (in_stack_fffffffffffffc88,(Index)in_stack_fffffffffffffc80,
             (Index)in_stack_fffffffffffffc78);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>::
  operator=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffc88);
  toEigen<2u,3u>((MatrixFixSize<2U,_3U> *)in_stack_fffffffffffffc88);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>>::block<1,3>
            (in_stack_fffffffffffffc88,(Index)in_stack_fffffffffffffc80,
             (Index)in_stack_fffffffffffffc78);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,2,3,1,2,3>,0,Eigen::Stride<0,0>>,1,3,false>::
  operator=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  this_01 = (ConvexHullProjectionConstraint *)local_100;
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::vector
            ((vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *)0x15298b);
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::size(local_30);
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::resize
            (in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
  local_118 = (Position *)0x0;
  while (pos3dInAbsoluteFrame = local_118,
        pPVar2 = (Position *)
                 std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::size(local_30),
        pos3dInAbsoluteFrame < pPVar2) {
    std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::operator[]
              (local_30,(size_type)local_118);
    std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::operator[]
              ((vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)
               local_100._200_8_,(size_type)local_118);
    Polygon::applyTransform(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::operator[]
              ((vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *)local_100,
               (size_type)local_118);
    Polygon::operator=((Polygon *)in_stack_fffffffffffffc70,(Polygon *)in_stack_fffffffffffffc68);
    Polygon::~Polygon((Polygon *)0x152a65);
    local_118 = local_118 + 1;
  }
  std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::vector
            ((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *)
             0x152aa4);
  for (local_150 = 0;
      sVar3 = std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::size
                        ((vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *)local_100)
      , local_150 < sVar3; local_150 = local_150 + 1) {
    local_158 = 0;
    while( true ) {
      std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::operator[]
                ((vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *)local_100,
                 local_150);
      sVar4 = Polygon::getNrOfVertices((Polygon *)0x152b1a);
      if (sVar4 <= local_158) break;
      std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::operator[]
                ((vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *)local_100,
                 local_150);
      Polygon::operator()((Polygon *)in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68);
      project(in_RCX,pos3dInAbsoluteFrame);
      std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
      push_back((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      local_158 = local_158 + 1;
    }
  }
  sVar3 = std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
          size(local_148);
  if (sVar3 < 3) {
    local_1 = 0;
  }
  else {
    iVar5 = std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
            ::begin((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                     *)in_stack_fffffffffffffc68);
    iVar6 = std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
            ::end((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   *)in_stack_fffffffffffffc68);
    std::
    sort<__gnu_cxx::__normal_iterator<iDynTree::VectorFixSize<2u>*,std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>>,iDynTree::ConvexHullProjectionConstraint::buildConvexHull(iDynTree::Direction,iDynTree::Direction,iDynTree::Position,std::vector<iDynTree::Polygon,std::allocator<iDynTree::Polygon>>const&,std::vector<iDynTree::Transform,std::allocator<iDynTree::Transform>>const&)::__0>
              (iVar5._M_current,iVar6._M_current);
    std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::size
              (local_148);
    std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::resize
              ((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *
               )in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
    local_190 = 0;
    for (local_194 = 0;
        sVar3 = std::
                vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
                size(local_148), (ulong)(long)local_194 < sVar3; local_194 = local_194 + 1) {
      while( true ) {
        in_stack_fffffffffffffcc7 = false;
        if (1 < local_190) {
          in_stack_fffffffffffffcb0 =
               (vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *
               )(in_RDI + 8);
          std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
          operator[](in_stack_fffffffffffffcb0,local_190 - 2);
          std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
          operator[](in_stack_fffffffffffffcb0,local_190 - 1);
          std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
          operator[](local_148,(long)local_194);
          o.m_data[1]._0_7_ = in_stack_fffffffffffffcc0;
          o.m_data[0] = in_stack_fffffffffffffcb8;
          o.m_data[1]._7_1_ = in_stack_fffffffffffffcc7;
          a.m_data[1] = (double)in_stack_fffffffffffffcb0;
          a.m_data[0] = (double)in_stack_fffffffffffffca8;
          b.m_data[1]._0_7_ = in_stack_fffffffffffffca0;
          b.m_data[0] = (double)in_stack_fffffffffffffc98;
          b.m_data[1]._7_1_ = in_stack_fffffffffffffca7;
          in_stack_fffffffffffffcb8 = monotono_chain_cross(o,a,b);
          in_stack_fffffffffffffcc7 = in_stack_fffffffffffffcb8 <= 0.0;
        }
        if ((bool)in_stack_fffffffffffffcc7 == false) break;
        local_190 = local_190 - 1;
      }
      in_stack_fffffffffffffca8 =
           std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
           operator[](local_148,(long)local_194);
      pvVar7 = std::
               vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
               operator[]((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                           *)(in_RDI + 8),local_190);
      pvVar7->m_data[0] = in_stack_fffffffffffffca8->m_data[0];
      pvVar7->m_data[1] = in_stack_fffffffffffffca8->m_data[1];
      local_190 = local_190 + 1;
    }
    sVar3 = std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
            ::size(local_148);
    iVar1 = (int)local_190;
    for (local_1cc = (int)sVar3 + -2; -1 < local_1cc; local_1cc = local_1cc + -1) {
      while( true ) {
        uVar9 = false;
        if ((ulong)(long)(iVar1 + 1) <= local_190) {
          in_stack_fffffffffffffc90 =
               (vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *)(in_RDI + 8);
          std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
          operator[]((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                      *)in_stack_fffffffffffffc90,local_190 - 2);
          std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
          operator[]((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                      *)in_stack_fffffffffffffc90,local_190 - 1);
          std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
          operator[](local_148,(long)local_1cc);
          o_00.m_data[1]._0_7_ = in_stack_fffffffffffffcc0;
          o_00.m_data[0] = in_stack_fffffffffffffcb8;
          o_00.m_data[1]._7_1_ = in_stack_fffffffffffffcc7;
          a_00.m_data[1] = (double)in_stack_fffffffffffffcb0;
          a_00.m_data[0] = (double)in_stack_fffffffffffffca8;
          b_00.m_data[1]._0_7_ = in_stack_fffffffffffffca0;
          b_00.m_data[0] = (double)in_stack_fffffffffffffc98;
          b_00.m_data[1]._7_1_ = uVar9;
          in_stack_fffffffffffffc98 = (MatrixDynSize *)monotono_chain_cross(o_00,a_00,b_00);
          uVar9 = (double)in_stack_fffffffffffffc98 <= 0.0;
        }
        if ((bool)uVar9 == false) break;
        local_190 = local_190 - 1;
      }
      in_stack_fffffffffffffc88 =
           (DenseBase<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>_> *)
           std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
           operator[](local_148,(long)local_1cc);
      pvVar7 = std::
               vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::
               operator[]((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                           *)(in_RDI + 8),local_190);
      pvVar7->m_data[0] = *(double *)in_stack_fffffffffffffc88;
      pvVar7->m_data[1] = *(double *)(in_stack_fffffffffffffc88 + 8);
      local_190 = local_190 + 1;
    }
    std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::resize
              ((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *
               )in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
    buildConstraintMatrix(this_01);
    uVar8 = in_RDI + 200;
    in_stack_fffffffffffffc80 =
         (MatrixBase<Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>_> *)
         iDynTree::MatrixDynSize::rows();
    this_00 = (Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
              MatrixFixSize<2U,_3U>::cols((MatrixFixSize<2U,_3U> *)(in_RDI + 0x68));
    iDynTree::MatrixDynSize::resize(uVar8,(ulong)in_stack_fffffffffffffc80);
    toEigen(in_stack_fffffffffffffc98);
    toEigen<2u,3u>((MatrixFixSize<2U,_3U> *)in_stack_fffffffffffffc88);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator*((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    toEigen(in_stack_fffffffffffffc98);
    Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
              (this_00,(DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                        *)in_stack_fffffffffffffc68);
    local_1 = 1;
  }
  std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::~vector
            ((vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> *)
             in_stack_fffffffffffffc80);
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::~vector
            ((vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *)
             in_stack_fffffffffffffc80);
  return (bool)(local_1 & 1);
}

Assistant:

bool ConvexHullProjectionConstraint::buildConvexHull(const iDynTree::Direction xAxisOfPlaneInWorld,
                                                         const iDynTree::Direction yAxisOfPlaneInWorld,
                                                         const iDynTree::Position originOfPlaneInWorld,
                                                         const std::vector<Polygon> &supportPolygonsExpressedInSupportFrame,
                                                         const std::vector<Transform> &absoluteFrame_X_supportFrame)
    {
        o = originOfPlaneInWorld;
        toEigen(P).block<1, 3>(0,0) = toEigen(xAxisOfPlaneInWorld);
        toEigen(P).block<1, 3>(1,0) = toEigen(yAxisOfPlaneInWorld);

        // Transform the polygons in the absolute frame
        std::vector<Polygon> supportPolygonsExpressedInAbsoluteFrame;

        supportPolygonsExpressedInAbsoluteFrame.resize(supportPolygonsExpressedInSupportFrame.size());

        for(size_t i=0; i< supportPolygonsExpressedInSupportFrame.size(); i++)
        {
            supportPolygonsExpressedInAbsoluteFrame[i] = supportPolygonsExpressedInSupportFrame[i].applyTransform(absoluteFrame_X_supportFrame[i]);
        }

        // Project the polygons on the projection plane
        std::vector<Vector2> projectedPoints;

        for(size_t poly=0; poly < supportPolygonsExpressedInAbsoluteFrame.size(); poly++)
        {
            for(size_t vertex=0; vertex < supportPolygonsExpressedInAbsoluteFrame[poly].getNrOfVertices(); vertex++)
            {
                 Vector2 newProjectedPoint = project(supportPolygonsExpressedInAbsoluteFrame[poly](vertex));
                 //toEigen(newProjectedPoint) = toEigen(P)*toEigen(supportPolygonsExpressedInAbsoluteFrame[poly](vertex)-o);
                 projectedPoints.push_back(newProjectedPoint);
            }
        }

        if (projectedPoints.size() <= 2)
        {
            return false;
        }

        // Compute the convex hull using the Monotone Chain

        // Order the projected points with a lexographical ordering
        struct
        {
            bool operator()(Vector2 a, Vector2 b)
            {
                return (a(0) < b(0)) || ( (a(0) == b(0)) && (a(1) < b(1)) );
            }
        } vector2lexographical;

        std::sort(projectedPoints.begin(), projectedPoints.end(), vector2lexographical);

        // Reset the convex hull (it will be properly resized after running the algorithm
        projectedConvexHull.m_vertices.resize(2*projectedPoints.size());
        size_t k = 0;

        // Build the upper hull
        for (int i = 0; i < projectedPoints.size(); ++i)
        {
            while (k >= 2 && monotono_chain_cross(projectedConvexHull.m_vertices[k-2],
                                                  projectedConvexHull.m_vertices[k-1],
                                                  projectedPoints[i]) <= 0)
            {
                k = k-1;
            }

            projectedConvexHull.m_vertices[k] = projectedPoints[i];
            k = k+1;

        }

        // Build the lower hull
        for (int i = projectedPoints.size()-2, t = k+1; i >= 0; i--)
        {
            while (k >= t && monotono_chain_cross(projectedConvexHull.m_vertices[k-2],
                                                  projectedConvexHull.m_vertices[k-1],
                                                  projectedPoints[i]) <= 0)
            {
                k = k-1;
            }

            projectedConvexHull.m_vertices[k] = projectedPoints[i];
            k = k+1;
        }

        projectedConvexHull.m_vertices.resize(k-1);

        // Build the constraint matrix
        buildConstraintMatrix();

        // Update AtimesP matrix
        AtimesP.resize(A.rows(),P.cols());

        toEigen(AtimesP) = toEigen(A)*toEigen(P);

        return true;
    }